

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageCompare.cpp
# Opt level: O0

bool tcu::intThresholdPositionDeviationErrorThresholdCompare
               (TestLog *log,char *imageSetName,char *imageSetDesc,ConstPixelBufferAccess *reference
               ,ConstPixelBufferAccess *result,UVec4 *threshold,IVec3 *maxPositionDeviation,
               bool acceptOutOfBoundsAsAnyValue,int maxAllowedFailingPixels,CompareLogMode logMode)

{
  void **this;
  byte bVar1;
  bool bVar2;
  int width_00;
  TextureChannelClass TVar3;
  TextureFormat *pTVar4;
  MessageBuilder *pMVar5;
  TestLog *pTVar6;
  allocator<char> local_9f9;
  string local_9f8;
  allocator<char> local_9d1;
  string local_9d0;
  LogImage local_9b0;
  allocator<char> local_919;
  string local_918;
  allocator<char> local_8f1;
  string local_8f0;
  LogImageSet local_8d0;
  TextureFormat local_88c;
  allocator<char> local_881;
  string local_880;
  allocator<char> local_859;
  string local_858;
  LogImage local_838;
  allocator<char> local_7a1;
  string local_7a0;
  allocator<char> local_779;
  string local_778;
  LogImage local_758;
  allocator<char> local_6c1;
  string local_6c0;
  allocator<char> local_699;
  string local_698;
  LogImage local_678;
  allocator<char> local_5e1;
  string local_5e0;
  allocator<char> local_5b9;
  string local_5b8;
  LogImageSet local_598;
  MessageBuilder local_558;
  MessageBuilder local_3d8;
  MessageBuilder local_258;
  undefined1 local_d4 [8];
  Vec4 pixelScale;
  Vec4 pixelBias;
  bool compareOk;
  int numFailingPixels;
  undefined1 local_a0 [8];
  PixelBufferAccess errorMask;
  undefined1 local_70 [8];
  TextureLevel errorMaskStorage;
  int depth;
  int height;
  int width;
  bool acceptOutOfBoundsAsAnyValue_local;
  UVec4 *threshold_local;
  ConstPixelBufferAccess *result_local;
  ConstPixelBufferAccess *reference_local;
  char *imageSetDesc_local;
  char *imageSetName_local;
  TestLog *log_local;
  
  width_00 = ConstPixelBufferAccess::getWidth(reference);
  errorMaskStorage.m_data.m_cap._4_4_ = ConstPixelBufferAccess::getHeight(reference);
  errorMaskStorage.m_data.m_cap._0_4_ = ConstPixelBufferAccess::getDepth(reference);
  this = &errorMask.super_ConstPixelBufferAccess.m_data;
  TextureFormat::TextureFormat((TextureFormat *)this,RGB,UNORM_INT8);
  TextureLevel::TextureLevel
            ((TextureLevel *)local_70,(TextureFormat *)this,width_00,
             errorMaskStorage.m_data.m_cap._4_4_,(int)errorMaskStorage.m_data.m_cap);
  TextureLevel::getAccess((PixelBufferAccess *)local_a0,(TextureLevel *)local_70);
  pixelBias.m_data[3] =
       (float)anon_unknown_47::findNumPositionDeviationFailingPixels
                        ((PixelBufferAccess *)local_a0,reference,result,threshold,
                         maxPositionDeviation,acceptOutOfBoundsAsAnyValue);
  pixelBias.m_data[2]._3_1_ = (int)pixelBias.m_data[3] <= maxAllowedFailingPixels;
  Vector<float,_4>::Vector((Vector<float,_4> *)(pixelScale.m_data + 2),0.0,0.0,0.0,0.0);
  Vector<float,_4>::Vector((Vector<float,_4> *)local_d4,1.0,1.0,1.0,1.0);
  if (((pixelBias.m_data[2]._3_1_ & 1) != 0) && (logMode != COMPARE_LOG_EVERYTHING)) {
    if (logMode == COMPARE_LOG_RESULT) {
      pTVar4 = ConstPixelBufferAccess::getFormat(result);
      TextureFormat::TextureFormat(&local_88c,RGBA,UNORM_INT8);
      bVar2 = TextureFormat::operator!=(pTVar4,&local_88c);
      if (bVar2) {
        computePixelScaleBias(result,(Vec4 *)local_d4,(Vec4 *)(pixelScale.m_data + 2));
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_8f0,imageSetName,&local_8f1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_918,imageSetDesc,&local_919);
      LogImageSet::LogImageSet(&local_8d0,&local_8f0,&local_918);
      pTVar6 = TestLog::operator<<(log,&local_8d0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_9d0,"Result",&local_9d1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_9f8,"Result",&local_9f9);
      LogImage::LogImage(&local_9b0,&local_9d0,&local_9f8,result,(Vec4 *)local_d4,
                         (Vec4 *)(pixelScale.m_data + 2),QP_IMAGE_COMPRESSION_MODE_BEST);
      pTVar6 = TestLog::operator<<(pTVar6,&local_9b0);
      TestLog::operator<<(pTVar6,(EndImageSetToken *)&TestLog::EndImageSet);
      LogImage::~LogImage(&local_9b0);
      std::__cxx11::string::~string((string *)&local_9f8);
      std::allocator<char>::~allocator(&local_9f9);
      std::__cxx11::string::~string((string *)&local_9d0);
      std::allocator<char>::~allocator(&local_9d1);
      LogImageSet::~LogImageSet(&local_8d0);
      std::__cxx11::string::~string((string *)&local_918);
      std::allocator<char>::~allocator(&local_919);
      std::__cxx11::string::~string((string *)&local_8f0);
      std::allocator<char>::~allocator(&local_8f1);
    }
    goto LAB_0291e27a;
  }
  pTVar4 = ConstPixelBufferAccess::getFormat(reference);
  TVar3 = getTextureChannelClass(pTVar4->type);
  if (TVar3 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
    pTVar4 = ConstPixelBufferAccess::getFormat(result);
    TVar3 = getTextureChannelClass(pTVar4->type);
    if (TVar3 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) goto LAB_0291d5ec;
  }
  else {
LAB_0291d5ec:
    anon_unknown_47::computeScaleAndBias
              (reference,result,(Vec4 *)local_d4,(Vec4 *)(pixelScale.m_data + 2));
    TestLog::operator<<(&local_258,log,(BeginMessageToken *)&TestLog::Message);
    pMVar5 = MessageBuilder::operator<<
                       (&local_258,
                        (char (*) [61])
                        "Result and reference images are normalized with formula p * ");
    pMVar5 = MessageBuilder::operator<<(pMVar5,(Vector<float,_4> *)local_d4);
    pMVar5 = MessageBuilder::operator<<(pMVar5,(char (*) [4])0x2b9c425);
    pMVar5 = MessageBuilder::operator<<(pMVar5,(Vector<float,_4> *)(pixelScale.m_data + 2));
    MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&TestLog::EndMessage);
    MessageBuilder::~MessageBuilder(&local_258);
  }
  if ((pixelBias.m_data[2]._3_1_ & 1) == 0) {
    TestLog::operator<<(&local_3d8,log,(BeginMessageToken *)&TestLog::Message);
    pMVar5 = MessageBuilder::operator<<(&local_3d8,(char (*) [26])"Image comparison failed:\n");
    pMVar5 = MessageBuilder::operator<<(pMVar5,(char (*) [31])"\tallowed position deviation = ");
    pMVar5 = MessageBuilder::operator<<(pMVar5,maxPositionDeviation);
    pMVar5 = MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b9e07b);
    pMVar5 = MessageBuilder::operator<<(pMVar5,(char (*) [20])"\tcolor threshold = ");
    pMVar5 = MessageBuilder::operator<<(pMVar5,threshold);
    MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&TestLog::EndMessage);
    MessageBuilder::~MessageBuilder(&local_3d8);
  }
  TestLog::operator<<(&local_558,log,(BeginMessageToken *)&TestLog::Message);
  pMVar5 = MessageBuilder::operator<<(&local_558,(char (*) [28])"Number of failing pixels = ");
  pMVar5 = MessageBuilder::operator<<(pMVar5,(int *)(pixelBias.m_data + 3));
  pMVar5 = MessageBuilder::operator<<(pMVar5,(char (*) [17])", max allowed = ");
  pMVar5 = MessageBuilder::operator<<(pMVar5,&maxAllowedFailingPixels);
  MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&TestLog::EndMessage);
  MessageBuilder::~MessageBuilder(&local_558);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5b8,imageSetName,&local_5b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5e0,imageSetDesc,&local_5e1);
  LogImageSet::LogImageSet(&local_598,&local_5b8,&local_5e0);
  pTVar6 = TestLog::operator<<(log,&local_598);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_698,"Result",&local_699);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6c0,"Result",&local_6c1);
  LogImage::LogImage(&local_678,&local_698,&local_6c0,result,(Vec4 *)local_d4,
                     (Vec4 *)(pixelScale.m_data + 2),QP_IMAGE_COMPRESSION_MODE_BEST);
  pTVar6 = TestLog::operator<<(pTVar6,&local_678);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_778,"Reference",&local_779);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7a0,"Reference",&local_7a1);
  LogImage::LogImage(&local_758,&local_778,&local_7a0,reference,(Vec4 *)local_d4,
                     (Vec4 *)(pixelScale.m_data + 2),QP_IMAGE_COMPRESSION_MODE_BEST);
  pTVar6 = TestLog::operator<<(pTVar6,&local_758);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_858,"ErrorMask",&local_859);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_880,"Error mask",&local_881);
  LogImage::LogImage(&local_838,&local_858,&local_880,(ConstPixelBufferAccess *)local_a0,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
  pTVar6 = TestLog::operator<<(pTVar6,&local_838);
  TestLog::operator<<(pTVar6,(EndImageSetToken *)&TestLog::EndImageSet);
  LogImage::~LogImage(&local_838);
  std::__cxx11::string::~string((string *)&local_880);
  std::allocator<char>::~allocator(&local_881);
  std::__cxx11::string::~string((string *)&local_858);
  std::allocator<char>::~allocator(&local_859);
  LogImage::~LogImage(&local_758);
  std::__cxx11::string::~string((string *)&local_7a0);
  std::allocator<char>::~allocator(&local_7a1);
  std::__cxx11::string::~string((string *)&local_778);
  std::allocator<char>::~allocator(&local_779);
  LogImage::~LogImage(&local_678);
  std::__cxx11::string::~string((string *)&local_6c0);
  std::allocator<char>::~allocator(&local_6c1);
  std::__cxx11::string::~string((string *)&local_698);
  std::allocator<char>::~allocator(&local_699);
  LogImageSet::~LogImageSet(&local_598);
  std::__cxx11::string::~string((string *)&local_5e0);
  std::allocator<char>::~allocator(&local_5e1);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::allocator<char>::~allocator(&local_5b9);
LAB_0291e27a:
  bVar1 = pixelBias.m_data[2]._3_1_;
  TextureLevel::~TextureLevel((TextureLevel *)local_70);
  return (bool)(bVar1 & 1);
}

Assistant:

bool intThresholdPositionDeviationErrorThresholdCompare (TestLog& log, const char* imageSetName, const char* imageSetDesc, const ConstPixelBufferAccess& reference, const ConstPixelBufferAccess& result, const UVec4& threshold, const tcu::IVec3& maxPositionDeviation, bool acceptOutOfBoundsAsAnyValue, int maxAllowedFailingPixels, CompareLogMode logMode)
{
	const int			width				= reference.getWidth();
	const int			height				= reference.getHeight();
	const int			depth				= reference.getDepth();
	TextureLevel		errorMaskStorage	(TextureFormat(TextureFormat::RGB, TextureFormat::UNORM_INT8), width, height, depth);
	PixelBufferAccess	errorMask			= errorMaskStorage.getAccess();
	const int			numFailingPixels	= findNumPositionDeviationFailingPixels(errorMask, reference, result, threshold, maxPositionDeviation, acceptOutOfBoundsAsAnyValue);
	const bool			compareOk			= numFailingPixels <= maxAllowedFailingPixels;
	Vec4				pixelBias			(0.0f, 0.0f, 0.0f, 0.0f);
	Vec4				pixelScale			(1.0f, 1.0f, 1.0f, 1.0f);

	if (!compareOk || logMode == COMPARE_LOG_EVERYTHING)
	{
		// All formats except normalized unsigned fixed point ones need remapping in order to fit into unorm channels in logged images.
		if (tcu::getTextureChannelClass(reference.getFormat().type)	!= tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT ||
			tcu::getTextureChannelClass(result.getFormat().type)	!= tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT)
		{
			computeScaleAndBias(reference, result, pixelScale, pixelBias);
			log << TestLog::Message << "Result and reference images are normalized with formula p * " << pixelScale << " + " << pixelBias << TestLog::EndMessage;
		}

		if (!compareOk)
			log	<< TestLog::Message
				<< "Image comparison failed:\n"
				<< "\tallowed position deviation = " << maxPositionDeviation << "\n"
				<< "\tcolor threshold = " << threshold
				<< TestLog::EndMessage;
		log << TestLog::Message << "Number of failing pixels = " << numFailingPixels << ", max allowed = " << maxAllowedFailingPixels << TestLog::EndMessage;

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",		result,		pixelScale, pixelBias)
			<< TestLog::Image("Reference",	"Reference",	reference,	pixelScale, pixelBias)
			<< TestLog::Image("ErrorMask",	"Error mask",	errorMask)
			<< TestLog::EndImageSet;
	}
	else if (logMode == COMPARE_LOG_RESULT)
	{
		if (result.getFormat() != TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8))
			computePixelScaleBias(result, pixelScale, pixelBias);

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",		result,		pixelScale, pixelBias)
			<< TestLog::EndImageSet;
	}

	return compareOk;
}